

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

char * rapidjson::internal::Prettify(char *buffer,int length,int k)

{
  int iVar1;
  int local_30;
  int i_1;
  int offset;
  int i;
  int kk;
  int k_local;
  int length_local;
  char *buffer_local;
  
  iVar1 = length + k;
  if ((iVar1 < length) || (i_1 = length, 0x15 < iVar1)) {
    if ((iVar1 < 1) || (0x15 < iVar1)) {
      if ((iVar1 < -5) || (0 < iVar1)) {
        if (length == 1) {
          buffer[1] = 'e';
          buffer_local = WriteExponent(iVar1 + -1,buffer + 2);
        }
        else {
          memmove(buffer + 2,buffer + 1,(long)(length + -1));
          buffer[1] = '.';
          buffer[length + 1] = 'e';
          buffer_local = WriteExponent(iVar1 + -1,buffer + (length + 2));
        }
      }
      else {
        iVar1 = 2 - iVar1;
        memmove(buffer + iVar1,buffer,(long)length);
        *buffer = '0';
        buffer[1] = '.';
        for (local_30 = 2; local_30 < iVar1; local_30 = local_30 + 1) {
          buffer[local_30] = '0';
        }
        buffer_local = buffer + (length + iVar1);
      }
    }
    else {
      memmove(buffer + (iVar1 + 1),buffer + iVar1,(long)(length - iVar1));
      buffer[iVar1] = '.';
      buffer_local = buffer + (length + 1);
    }
  }
  else {
    for (; i_1 < iVar1; i_1 = i_1 + 1) {
      buffer[i_1] = '0';
    }
    buffer[iVar1] = '.';
    buffer[iVar1 + 1] = '0';
    buffer_local = buffer + (iVar1 + 2);
  }
  return buffer_local;
}

Assistant:

inline char* Prettify(char* buffer, int length, int k) {
    const int kk = length + k;  // 10^(kk-1) <= v < 10^kk

    if (length <= kk && kk <= 21) {
        // 1234e7 -> 12340000000
        for (int i = length; i < kk; i++)
            buffer[i] = '0';
        buffer[kk] = '.';
        buffer[kk + 1] = '0';
        return &buffer[kk + 2];
    }
    else if (0 < kk && kk <= 21) {
        // 1234e-2 -> 12.34
        std::memmove(&buffer[kk + 1], &buffer[kk], length - kk);
        buffer[kk] = '.';
        return &buffer[length + 1];
    }
    else if (-6 < kk && kk <= 0) {
        // 1234e-6 -> 0.001234
        const int offset = 2 - kk;
        std::memmove(&buffer[offset], &buffer[0], length);
        buffer[0] = '0';
        buffer[1] = '.';
        for (int i = 2; i < offset; i++)
            buffer[i] = '0';
        return &buffer[length + offset];
    }
    else if (length == 1) {
        // 1e30
        buffer[1] = 'e';
        return WriteExponent(kk - 1, &buffer[2]);
    }
    else {
        // 1234e30 -> 1.234e33
        std::memmove(&buffer[2], &buffer[1], length - 1);
        buffer[1] = '.';
        buffer[length + 1] = 'e';
        return WriteExponent(kk - 1, &buffer[0 + length + 2]);
    }
}